

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O2

void Gia_PolynBuildAdd(Pln_Man_t *p,Vec_Int_t *vTempC,Vec_Int_t *vTempM)

{
  uint *puVar1;
  Vec_Flt_t *p_00;
  Vec_Que_t *p_01;
  int *piVar2;
  int *piVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  
  if (vTempM == (Vec_Int_t *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = Hsh_VecManAdd(p->pHashM,vTempM);
  }
  p->nBuilds = p->nBuilds + 1;
  if (iVar5 == p->vCoefs->nSize) {
    iVar6 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntPush(p->vCoefs,iVar6);
    p_00 = p->vCounts;
    pVVar12 = p->vOrder;
    iVar7 = Vec_IntEntryLast(vTempM);
    iVar7 = Vec_IntEntry(pVVar12,iVar7);
    Vec_FltPush(p_00,(float)iVar7);
    p_01 = p->vQue;
    iVar7 = p_01->nCap;
    if (iVar7 <= p_01->nSize) {
      iVar8 = p_01->nSize + 1;
      iVar16 = iVar7 * 2;
      if (iVar7 * 2 < iVar8) {
        iVar16 = iVar8;
      }
      Vec_QueGrow(p_01,iVar16);
      iVar7 = p_01->nCap;
    }
    if (iVar7 <= iVar5) {
      iVar8 = iVar5 + 1;
      iVar16 = iVar7 * 2;
      if (iVar8 != iVar16 && SBORROW4(iVar8,iVar16) == iVar8 + iVar7 * -2 < 0) {
        iVar16 = iVar8;
      }
      Vec_QueGrow(p_01,iVar16);
      iVar7 = p_01->nCap;
    }
    iVar16 = p_01->nSize;
    if (iVar7 <= iVar16) {
      __assert_fail("p->nSize < p->nCap",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar2 = p_01->pOrder;
    if (piVar2[iVar5] != -1) {
      __assert_fail("p->pOrder[v] == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar3 = p_01->pHeap;
    if (piVar3[iVar16] != -1) {
      __assert_fail("p->pHeap[p->nSize] == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar2[iVar5] = iVar16;
    iVar7 = p_01->nSize;
    p_01->nSize = iVar7 + 1;
    piVar3[iVar7] = iVar5;
    pfVar4 = *p_01->pCostsFlt;
    if (pfVar4 == (float *)0x0) {
      fVar17 = (float)iVar5;
    }
    else {
      fVar17 = pfVar4[iVar5];
    }
    uVar15 = (ulong)piVar2[iVar5];
    if (uVar15 == 0xffffffffffffffff) {
      __assert_fail("p->pOrder[v] != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (piVar3[uVar15] != iVar5) {
      __assert_fail("p->pHeap[i] == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    while (iVar7 = (int)uVar15, 1 < iVar7) {
      iVar16 = piVar3[(uint)(iVar7 >> 1)];
      if (pfVar4 == (float *)0x0) {
        fVar18 = (float)iVar16;
      }
      else {
        fVar18 = pfVar4[iVar16];
      }
      if (fVar17 <= fVar18) break;
      piVar3[uVar15 & 0xffffffff] = iVar16;
      piVar2[iVar16] = iVar7;
      uVar15 = (ulong)(uint)(iVar7 >> 1);
    }
    piVar3[iVar7] = iVar5;
    piVar2[iVar5] = iVar7;
    if (iVar6 == 0) {
      return;
    }
  }
  else {
    iVar7 = Vec_IntEntry(p->vCoefs,iVar5);
    if (iVar7 != 0) {
      pVVar12 = Hsh_VecReadEntry(p->pHashC,iVar7);
      iVar6 = 0;
LAB_004e5303:
      if (iVar6 < pVVar12->nSize) {
        uVar9 = Vec_IntEntry(pVVar12,iVar6);
LAB_004e531b:
        do {
          if (uVar9 == 0) {
            __assert_fail("New != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecPolyn.c"
                          ,199,"void Gia_PolynMergeConstOne(Vec_Int_t *, int)");
          }
          uVar14 = -uVar9;
          if (0 < (int)uVar9) {
            uVar14 = uVar9;
          }
          iVar16 = 0;
          while( true ) {
            uVar10 = vTempC->nSize;
            if ((int)uVar10 <= iVar16) {
              uVar15 = 0;
              if (0 < (int)uVar10) {
                uVar15 = (ulong)uVar10;
              }
              uVar13 = 0;
              goto LAB_004e53bd;
            }
            uVar10 = Vec_IntEntry(vTempC,iVar16);
            if (uVar10 == 0) {
              __assert_fail("Old != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecPolyn.c"
                            ,0xca,"void Gia_PolynMergeConstOne(Vec_Int_t *, int)");
            }
            if (uVar10 == uVar9) {
              Vec_IntDrop(vTempC,iVar16);
              uVar9 = (uVar9 - 1) + (uint)(0 < (int)uVar9) * 2;
              goto LAB_004e531b;
            }
            uVar11 = -uVar10;
            if (0 < (int)uVar10) {
              uVar11 = uVar10;
            }
            if (uVar11 == uVar14) {
              Vec_IntDrop(vTempC,iVar16);
              goto LAB_004e5436;
            }
            iVar8 = uVar10 + uVar9;
            if ((iVar8 == 1) || (iVar8 == -1)) break;
            iVar16 = iVar16 + 1;
          }
          if (uVar11 < uVar14) {
            uVar14 = uVar11;
          }
          Vec_IntDrop(vTempC,iVar16);
          uVar9 = -uVar14;
          if (iVar8 == 1) {
            uVar9 = uVar14;
          }
        } while( true );
      }
    }
    iVar6 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntWriteEntry(p->vCoefs,iVar5,iVar6);
    if (iVar7 != 0 && iVar6 == 0) {
      iVar5 = -1;
      goto LAB_004e54fc;
    }
    if (iVar7 != 0 || iVar6 == 0) {
      return;
    }
  }
  iVar5 = 1;
LAB_004e54fc:
  p->nUsed = p->nUsed + iVar5;
  return;
LAB_004e53bd:
  if (uVar15 != uVar13) {
    puVar1 = (uint *)(vTempC->pArray + uVar13);
    uVar13 = uVar13 + 1;
    if (*puVar1 == uVar9) goto LAB_004e5436;
    goto LAB_004e53bd;
  }
  if (uVar10 == vTempC->nCap) {
    iVar16 = uVar10 * 2;
    if ((int)uVar10 < 0x10) {
      iVar16 = 0x10;
    }
    Vec_IntGrow(vTempC,iVar16);
    uVar10 = vTempC->nSize;
  }
  vTempC->nSize = uVar10 + 1;
  piVar2 = vTempC->pArray;
  for (uVar15 = (ulong)uVar10;
      (uVar14 = (int)uVar10 >> 0x1f & uVar10, 0 < (int)(uint)uVar15 &&
      (uVar14 = (uint)uVar15, (int)uVar9 < piVar2[uVar15 - 1])); uVar15 = uVar15 - 1) {
    piVar2[uVar15] = piVar2[uVar15 - 1];
  }
  piVar2[(int)uVar14] = uVar9;
LAB_004e5436:
  pVVar12 = Hsh_VecReadEntry(p->pHashC,iVar7);
  iVar6 = iVar6 + 1;
  goto LAB_004e5303;
}

Assistant:

static inline void Gia_PolynBuildAdd( Pln_Man_t * p, Vec_Int_t * vTempC, Vec_Int_t * vTempM )
{
    int iConst, iConstNew, iMono = vTempM ? Hsh_VecManAdd(p->pHashM, vTempM) : 0;
    p->nBuilds++;
    if ( iMono == Vec_IntSize(p->vCoefs) ) // new monomial
    {
        iConst = Hsh_VecManAdd( p->pHashC, vTempC );
        Vec_IntPush( p->vCoefs, iConst );
//        Vec_FltPush( p->vCounts, Vec_IntEntryLast(vTempM) );
        Vec_FltPush( p->vCounts, (float)Vec_IntEntry(p->vOrder, Vec_IntEntryLast(vTempM)) );
        Vec_QuePush( p->vQue, iMono );
//        Vec_QueUpdate( p->vQue, iMono );
        if ( iConst )
            p->nUsed++;
        return;
    }
    // this monomial exists
    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst )
        Gia_PolynMergeConst( vTempC, p, iConst );
    iConstNew = Hsh_VecManAdd( p->pHashC, vTempC );
    Vec_IntWriteEntry( p->vCoefs, iMono, iConstNew );
    if ( iConst && !iConstNew )
        p->nUsed--;
    else if ( !iConst && iConstNew )
        p->nUsed++;
    //assert( p->nUsed == Vec_IntSize(p->vCoefs) - Vec_IntCountZero(p->vCoefs) );
}